

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O3

void xmlFAParsePosCharGroup(xmlRegParserCtxtPtr ctxt)

{
  byte *utf;
  xmlChar *pxVar1;
  byte bVar2;
  xmlChar xVar3;
  uint start;
  uint end;
  int neg;
  xmlRegAtomPtr atom;
  char *extra;
  xmlChar *pxVar4;
  int local_34;
  
  pxVar4 = ctxt->cur;
  xVar3 = *pxVar4;
  do {
    if (xVar3 == '\\') {
      xmlFAParseCharClassEsc(ctxt);
    }
    else {
      if ((xVar3 == ']') || (xVar3 == '[')) {
        ctxt->error = 0x5aa;
        extra = "Expecting a char range";
      }
      else if (xVar3 == '\0') {
        ctxt->error = 0x5aa;
        extra = "Expecting \']\'";
      }
      else {
        local_34 = 4;
        start = xmlGetUTF8Char(pxVar4,&local_34);
        if (-1 < (int)start) {
          pxVar4 = ctxt->cur;
          if ((((start == 0x2d) && (pxVar4[1] != ']')) && (pxVar4[-1] != '[')) &&
             (pxVar4[-1] != '^')) {
            ctxt->cur = pxVar4 + local_34;
            goto LAB_0017ffc1;
          }
          pxVar1 = pxVar4 + local_34;
          ctxt->cur = pxVar1;
          if (((pxVar4[local_34] == '-') && (pxVar1[1] != ']')) && (pxVar1[1] != '[')) {
            utf = pxVar1 + 1;
            ctxt->cur = utf;
            bVar2 = *utf;
            if (bVar2 < 0x5c) {
              if ((bVar2 == 0) || (bVar2 == 0x5b)) {
LAB_001800da:
                ctxt->error = 0x5aa;
                extra = "Expecting the end of a char range";
                goto LAB_0017ffbc;
              }
LAB_001800f0:
              local_34 = 4;
              end = xmlGetUTF8Char(utf,&local_34);
              if ((int)end < 0) goto LAB_00180104;
            }
            else {
              if (bVar2 == 0x5d) goto LAB_001800da;
              if (bVar2 != 0x5c) goto LAB_001800f0;
              ctxt->cur = pxVar1 + 2;
              bVar2 = pxVar1[2];
              end = (uint)bVar2;
              if (bVar2 < 0x72) {
                if (((0x36 < bVar2 - 0x28) ||
                    ((0x7800000080006fU >> ((ulong)(bVar2 - 0x28) & 0x3f) & 1) == 0)) &&
                   (end = 10, bVar2 != 0x6e)) {
LAB_00180181:
                  ctxt->error = 0x5aa;
                  extra = "Invalid escape value";
                  goto LAB_0017ffbc;
                }
              }
              else if (2 < end - 0x7b) {
                if (bVar2 == 0x74) {
                  end = 9;
                }
                else {
                  if (bVar2 != 0x72) goto LAB_00180181;
                  end = 0xd;
                }
              }
              local_34 = 1;
            }
            if (end < start) {
              ctxt->error = 0x5aa;
              extra = "End of range is before start of range";
              goto LAB_0017ffbc;
            }
            ctxt->cur = ctxt->cur + local_34;
            atom = ctxt->atom;
            neg = ctxt->neg;
          }
          else {
            atom = ctxt->atom;
            neg = ctxt->neg;
            end = start;
          }
          xmlRegAtomAddRange(ctxt,atom,neg,XML_REGEXP_CHARVAL,start,end,(xmlChar *)0x0);
          goto LAB_0017ffc1;
        }
LAB_00180104:
        ctxt->error = 0x5aa;
        extra = "Invalid UTF-8";
      }
LAB_0017ffbc:
      xmlRegexpErrCompile(ctxt,extra);
    }
LAB_0017ffc1:
    pxVar4 = ctxt->cur;
    xVar3 = *pxVar4;
    if ((((xVar3 == '\0') || (xVar3 == '-')) || (xVar3 == ']')) || (ctxt->error != 0)) {
      return;
    }
  } while( true );
}

Assistant:

static void
xmlFAParsePosCharGroup(xmlRegParserCtxtPtr ctxt) {
    do {
	if (CUR == '\\') {
	    xmlFAParseCharClassEsc(ctxt);
	} else {
	    xmlFAParseCharRange(ctxt);
	}
    } while ((CUR != ']') && (CUR != '-') &&
             (CUR != 0) && (ctxt->error == 0));
}